

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int porterNext(sqlite3_tokenizer_cursor *pCursor,char **pzToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  int iVar8;
  sqlite3_tokenizer *psVar9;
  long lVar10;
  size_t sVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  ulong uVar18;
  byte bVar19;
  sqlite3_tokenizer *psVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  byte *pbVar24;
  bool bVar25;
  char zReverse [28];
  byte *local_98;
  int *local_90;
  sqlite3_tokenizer *local_88;
  sqlite3_tokenizer *local_80;
  char **local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  byte abStack_58 [22];
  byte local_42 [18];
  
  psVar20 = pCursor[1].pTokenizer;
  local_90 = pnBytes;
  local_80 = psVar20;
  local_78 = pzToken;
  local_70 = piStartOffset;
  local_68 = piEndOffset;
  local_60 = piPosition;
  do {
    iVar8 = *(int *)&pCursor[2].pTokenizer;
    if (iVar8 <= *(int *)((long)&pCursor[2].pTokenizer + 4)) {
      return 0x65;
    }
    iVar21 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar22 = iVar21;
    if (iVar21 < iVar8) {
      pcVar12 = (char *)((long)&psVar20->pModule + (long)iVar21);
      do {
        cVar3 = *pcVar12;
        iVar22 = iVar21;
        if ((cVar3 < '\0') ||
           (('/' < cVar3 && ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar3 - 0x30] != '\0'))
           )) break;
        iVar21 = iVar21 + 1;
        *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar21;
        pcVar12 = pcVar12 + 1;
        iVar22 = iVar8;
      } while (iVar8 != iVar21);
    }
    iVar21 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar17 = iVar21;
    if (iVar21 < iVar8) {
      pcVar12 = (char *)((long)&psVar20->pModule + (long)iVar21);
      do {
        cVar3 = *pcVar12;
        if ((-1 < cVar3) &&
           ((iVar17 = iVar21, cVar3 < '0' ||
            ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar3 - 0x30] == '\0')))) break;
        iVar21 = iVar21 + 1;
        *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar21;
        pcVar12 = pcVar12 + 1;
        iVar17 = iVar8;
      } while (iVar8 != iVar21);
    }
    uVar23 = iVar17 - iVar22;
    if (uVar23 == 0 || iVar17 < iVar22) goto LAB_0017ab18;
    if (*(int *)&pCursor[5].pTokenizer < (int)uVar23) {
      local_88 = (sqlite3_tokenizer *)CONCAT44(local_88._4_4_,(int)pzToken);
      uVar1 = uVar23 + 0x14;
      *(uint *)&pCursor[5].pTokenizer = uVar1;
      psVar20 = pCursor[4].pTokenizer;
      iVar8 = sqlite3_initialize();
      if (iVar8 == 0) {
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        psVar9 = (sqlite3_tokenizer *)sqlite3Realloc(psVar20,(ulong)uVar1);
      }
      else {
        psVar9 = (sqlite3_tokenizer *)0x0;
      }
      psVar20 = local_80;
      if (psVar9 == (sqlite3_tokenizer *)0x0) {
        pzToken = (char **)0x7;
        goto LAB_0017ab18;
      }
      pCursor[4].pTokenizer = psVar9;
    }
    pcVar12 = (char *)((long)&psVar20->pModule + (long)iVar22);
    psVar9 = pCursor[4].pTokenizer;
    if (uVar23 - 0x15 < 0xffffffee) {
LAB_0017a173:
      copy_stemmer(pcVar12,uVar23,(char *)psVar9,local_90);
      goto LAB_0017aae8;
    }
    if ((int)uVar23 < 1) {
      lVar10 = 0x17;
    }
    else {
      pbVar14 = local_42;
      lVar10 = 0x1700000000;
      uVar18 = 0;
      do {
        bVar19 = pcVar12[uVar18];
        if ((byte)(bVar19 + 0xbf) < 0x1a) {
          bVar19 = bVar19 | 0x20;
        }
        else if (0x19 < (byte)(bVar19 + 0x9f)) goto LAB_0017a173;
        *pbVar14 = bVar19;
        uVar18 = uVar18 + 1;
        lVar10 = lVar10 + -0x100000000;
        pbVar14 = pbVar14 + -1;
      } while (uVar23 != uVar18);
      lVar10 = lVar10 >> 0x20;
    }
    local_42[5] = 0;
    local_42[1] = 0;
    local_42[2] = 0;
    local_42[3] = 0;
    local_42[4] = 0;
    pbVar14 = abStack_58 + lVar10;
    local_98 = pbVar14;
    if (*pbVar14 == 0x73) {
      local_98 = abStack_58 + lVar10 + 4;
      lVar15 = 0;
      do {
        if (lVar15 == 3) goto LAB_0017a29e;
        lVar2 = lVar15 + 1;
        lVar5 = lVar15 + 1;
        lVar6 = lVar15 + lVar10;
        lVar15 = lVar2;
      } while ("sess"[lVar5] == abStack_58[lVar6 + 1]);
      if ("sess"[lVar5] == 0) {
        local_98 = pbVar14 + lVar2;
LAB_0017a29e:
        bVar19 = 0x73;
        lVar10 = 0;
        do {
          local_98[-1] = bVar19;
          local_98 = local_98 + -1;
          bVar19 = "access"[lVar10 + 5];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 2);
      }
      else {
        local_98 = abStack_58 + lVar10 + 3;
        lVar15 = 0;
        do {
          if (lVar15 == 2) goto LAB_0017a2be;
          lVar2 = lVar15 + 1;
          lVar5 = lVar15 + 1;
          lVar6 = lVar15 + lVar10;
          lVar15 = lVar2;
        } while ("sei"[lVar5] == abStack_58[lVar6 + 1]);
        if ("sei"[lVar5] == 0) {
          local_98 = pbVar14 + lVar2;
LAB_0017a2be:
          local_98[-1] = 0x69;
          local_98 = local_98 + -1;
        }
        else {
          local_98 = abStack_58 + lVar10 + 2;
          lVar15 = 0;
          do {
            if (lVar15 == 1) goto LAB_0017a2cd;
            lVar2 = lVar15 + 1;
            lVar5 = lVar15 + 5;
            lVar6 = lVar15 + lVar10;
            lVar15 = lVar2;
          } while ("access"[lVar5] == abStack_58[lVar6 + 1]);
          if ("access"[lVar5] == 0) {
            local_98 = pbVar14 + lVar2;
LAB_0017a2cd:
            bVar19 = 0x73;
            lVar10 = 0;
            do {
              local_98[-1] = bVar19;
              local_98 = local_98 + -1;
              bVar19 = "access"[lVar10 + 5];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 2);
          }
          else {
            local_98 = abStack_58 + lVar10 + 1;
          }
        }
      }
    }
    pbVar14 = local_98;
    local_88 = psVar9;
    iVar8 = stem((char **)&local_98,"dee","ee",m_gt_0);
    if (iVar8 == 0) {
      if (*local_98 == 0x67) {
        pbVar13 = local_98 + 3;
        lVar10 = 0;
        do {
          pbVar7 = pbVar13;
          if (lVar10 == 2) goto LAB_0017a362;
          lVar15 = lVar10 + 1;
          lVar2 = lVar10 + 1;
          lVar5 = lVar10 + 1;
          lVar10 = lVar15;
        } while ("gni"[lVar2] == local_98[lVar5]);
        bVar25 = "gni"[lVar2] == 0;
        pbVar13 = local_98 + lVar15;
      }
      else {
        bVar25 = false;
        pbVar13 = local_98;
      }
      pbVar7 = pbVar13;
      if (bVar25) {
LAB_0017a362:
        do {
          pbVar24 = pbVar7;
          iVar8 = isConsonant((char *)pbVar24);
          pbVar7 = pbVar24 + 1;
        } while (iVar8 != 0);
        if (*pbVar24 != 0) {
          local_98 = pbVar13;
        }
      }
      else {
        if (*local_98 == 100) {
          pbVar13 = local_98 + 2;
          lVar10 = 0;
          do {
            pbVar7 = pbVar13;
            if (lVar10 == 1) goto LAB_0017a3c2;
            lVar15 = lVar10 + 1;
            lVar2 = lVar10 + 5;
            lVar5 = lVar10 + 1;
            lVar10 = lVar15;
          } while ("Divide"[lVar2] == local_98[lVar5]);
          bVar25 = "Divide"[lVar2] == 0;
          pbVar13 = local_98 + lVar15;
        }
        else {
          bVar25 = false;
          pbVar13 = local_98;
        }
        bVar4 = true;
        pbVar7 = pbVar13;
        if (bVar25) {
LAB_0017a3c2:
          do {
            pbVar24 = pbVar7;
            iVar8 = isConsonant((char *)pbVar24);
            pbVar7 = pbVar24 + 1;
          } while (iVar8 != 0);
          if (*pbVar24 != 0) {
            local_98 = pbVar13;
          }
          bVar4 = false;
        }
        if (bVar4) goto LAB_0017a530;
      }
      pbVar13 = local_98;
      if (local_98 != pbVar14) {
        bVar19 = *local_98;
        if (bVar19 == 0x74) {
          pbVar14 = local_98 + 2;
          lVar10 = 0;
          do {
            if (lVar10 == 1) goto LAB_0017a43b;
            lVar15 = lVar10 + 1;
            lVar2 = lVar10 + 9;
            lVar5 = lVar10 + 1;
            lVar10 = lVar15;
          } while ("SorterData"[lVar2] == local_98[lVar5]);
          bVar25 = "SorterData"[lVar2] == 0;
          pbVar14 = local_98 + lVar15;
        }
        else {
          bVar25 = false;
          pbVar14 = local_98;
        }
        if (bVar25) {
LAB_0017a43b:
          bVar19 = 0x61;
          lVar10 = 1;
          do {
            pbVar14[-1] = bVar19;
            pbVar14 = pbVar14 + -1;
            bVar19 = "ftruncate"[lVar10 + 6];
            lVar10 = lVar10 + 1;
            local_98 = pbVar14;
          } while (lVar10 != 4);
        }
        else {
          if (bVar19 == 0x6c) {
            pbVar14 = local_98 + 2;
            lVar10 = 0;
            do {
              if (lVar10 == 1) goto LAB_0017a4a3;
              lVar15 = lVar10 + 1;
              lVar2 = lVar10 + 2;
              lVar5 = lVar10 + 1;
              lVar10 = lVar15;
            } while ("ilb"[lVar2] == local_98[lVar5]);
            bVar25 = "ilb"[lVar2] == 0;
            pbVar14 = local_98 + lVar15;
          }
          else {
            bVar25 = false;
            pbVar14 = local_98;
          }
          if (bVar25) {
LAB_0017a4a3:
            bVar19 = 0x62;
            lVar10 = 1;
            do {
              pbVar14[-1] = bVar19;
              pbVar14 = pbVar14 + -1;
              bVar19 = "CreateTable"[lVar10 + 8];
              lVar10 = lVar10 + 1;
              local_98 = pbVar14;
            } while (lVar10 != 4);
          }
          else {
            if (bVar19 == 0x7a) {
              pbVar14 = local_98 + 2;
              lVar10 = 0;
              do {
                if (lVar10 == 1) goto LAB_0017a50c;
                lVar15 = lVar10 + 1;
                lVar2 = lVar10 + 6;
                lVar5 = lVar10 + 1;
                lVar10 = lVar15;
              } while ("noitazi"[lVar2] == local_98[lVar5]);
              bVar25 = "noitazi"[lVar2] == 0;
              pbVar14 = local_98 + lVar15;
            }
            else {
              bVar25 = false;
              pbVar14 = local_98;
            }
            if (bVar25) {
LAB_0017a50c:
              bVar19 = 0x69;
              lVar10 = 1;
              do {
                pbVar14[-1] = bVar19;
                pbVar14 = pbVar14 + -1;
                bVar19 = "optimize"[lVar10 + 5];
                lVar10 = lVar10 + 1;
                local_98 = pbVar14;
              } while (lVar10 != 4);
            }
            else {
              iVar8 = isConsonant((char *)local_98);
              if (((iVar8 == 0) || (bVar19 != pbVar13[1])) ||
                 ((uVar23 = bVar19 - 0x6c, uVar23 < 0xf && ((0x4081U >> (uVar23 & 0x1f) & 1) != 0)))
                 ) {
                iVar8 = m_eq_1((char *)pbVar13);
                if ((iVar8 != 0) && (iVar8 = star_oh((char *)pbVar13), iVar8 != 0)) {
                  pbVar13[-1] = 0x65;
                  local_98 = pbVar13 + -1;
                }
              }
              else {
                local_98 = pbVar13 + 1;
              }
            }
          }
        }
      }
    }
LAB_0017a530:
    psVar20 = local_80;
    pbVar13 = local_98;
    pbVar14 = local_98;
    if (*local_98 == 0x79) {
      do {
        pbVar14 = pbVar14 + 1;
        iVar8 = isConsonant((char *)pbVar14);
      } while (iVar8 != 0);
      if (*pbVar14 != 0) {
        *pbVar13 = 0x69;
      }
    }
    switch(pbVar13[1]) {
    case 0x61:
      iVar8 = stem((char **)&local_98,"lanoita","ate",m_gt_0);
      if (iVar8 == 0) {
        pcVar16 = "lanoit";
        pcVar12 = "tion";
        goto LAB_0017a74b;
      }
      break;
    case 99:
      iVar8 = stem((char **)&local_98,"icne","ence",m_gt_0);
      if (iVar8 == 0) {
        pcVar16 = "icna";
        pcVar12 = "ance";
        goto LAB_0017a74b;
      }
      break;
    case 0x65:
      pcVar16 = "rezi";
      pcVar12 = "ize";
      goto LAB_0017a74b;
    case 0x67:
      pcVar16 = "igol";
      pcVar12 = "log";
LAB_0017a74b:
      stem((char **)&local_98,pcVar16,pcVar12,m_gt_0);
      break;
    case 0x6c:
      iVar8 = stem((char **)&local_98,"ilb","ble",m_gt_0);
      if (((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"illa","al",m_gt_0), iVar8 == 0)) &&
         ((iVar8 = stem((char **)&local_98,"iltne","ent",m_gt_0), iVar8 == 0 &&
          (iVar8 = stem((char **)&local_98,"ile","e",m_gt_0), iVar8 == 0)))) {
        pcVar16 = "ilsuo";
LAB_0017a910:
        pcVar12 = "ous";
        goto LAB_0017a74b;
      }
      break;
    case 0x6f:
      iVar8 = stem((char **)&local_98,"noitazi","ize",m_gt_0);
      if ((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"noita","ate",m_gt_0), iVar8 == 0)) {
        pcVar16 = "rota";
        pcVar12 = "ate";
        goto LAB_0017a74b;
      }
      break;
    case 0x73:
      iVar8 = stem((char **)&local_98,"msila","al",m_gt_0);
      if (((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"ssenevi","ive",m_gt_0), iVar8 == 0)) &&
         (iVar8 = stem((char **)&local_98,"ssenluf","ful",m_gt_0), iVar8 == 0)) {
        pcVar16 = "ssensuo";
        goto LAB_0017a910;
      }
      break;
    case 0x74:
      iVar8 = stem((char **)&local_98,"itila","al",m_gt_0);
      if ((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"itivi","ive",m_gt_0), iVar8 == 0)) {
        pcVar16 = "itilib";
        pcVar12 = "ble";
        goto LAB_0017a74b;
      }
    }
    bVar19 = *local_98;
    if (bVar19 < 0x6c) {
      if (bVar19 == 0x65) {
        iVar8 = stem((char **)&local_98,"etaci","ic",m_gt_0);
        if ((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"evita","",m_gt_0), iVar8 == 0)) {
          pcVar12 = "ezila";
          pcVar16 = "al";
          goto LAB_0017a832;
        }
      }
      else if (bVar19 == 0x69) {
        pcVar12 = "itici";
        pcVar16 = "ic";
LAB_0017a832:
        stem((char **)&local_98,pcVar12,pcVar16,m_gt_0);
      }
    }
    else if (bVar19 == 0x6c) {
      iVar8 = stem((char **)&local_98,"laci","ic",m_gt_0);
      if (iVar8 == 0) {
        pcVar12 = "luf";
        goto LAB_0017a82b;
      }
    }
    else if (bVar19 == 0x73) {
      pcVar12 = "ssen";
LAB_0017a82b:
      pcVar16 = "";
      goto LAB_0017a832;
    }
    switch(local_98[1]) {
    case 0x61:
      if (*local_98 == 0x6c) {
LAB_0017a9c6:
        pbVar14 = local_98 + 2;
LAB_0017a9fd:
        iVar8 = m_gt_1((char *)pbVar14);
        if (iVar8 != 0) {
          local_98 = pbVar14;
        }
      }
      break;
    case 99:
      if (((*local_98 == 0x65) && (local_98[2] == 0x6e)) && ((local_98[3] | 4) == 0x65)) {
LAB_0017a9e6:
        pbVar14 = local_98 + 4;
        goto LAB_0017a9fd;
      }
      break;
    case 0x65:
      if (*local_98 == 0x72) goto LAB_0017a9c6;
      break;
    case 0x69:
      if (*local_98 == 99) goto LAB_0017a9c6;
      break;
    case 0x6c:
      if (((*local_98 == 0x65) && (local_98[2] == 0x62)) && ((local_98[3] | 8) == 0x69))
      goto LAB_0017a9e6;
      break;
    case 0x6e:
      if (*local_98 == 0x74) {
        if (local_98[2] == 0x65) {
          iVar8 = stem((char **)&local_98,"tneme","",m_gt_1);
          if ((iVar8 == 0) && (iVar8 = stem((char **)&local_98,"tnem","",m_gt_1), iVar8 == 0)) {
            pcVar12 = "tne";
            goto LAB_0017aa3a;
          }
        }
        else if (local_98[2] == 0x61) goto LAB_0017a9f9;
      }
      break;
    case 0x6f:
      if (*local_98 == 0x75) goto LAB_0017a9c6;
      if ((byte)(local_98[3] + 0x8d) < 2) {
        pcVar12 = "noi";
        goto LAB_0017aa3a;
      }
      break;
    case 0x73:
      if (*local_98 == 0x6d) {
LAB_0017a9b0:
        if (local_98[2] == 0x69) goto LAB_0017a9f9;
      }
      break;
    case 0x74:
      iVar8 = stem((char **)&local_98,"eta","",m_gt_1);
      if (iVar8 == 0) {
        pcVar12 = "iti";
LAB_0017aa3a:
        stem((char **)&local_98,pcVar12,"",m_gt_1);
      }
      break;
    case 0x75:
      if ((*local_98 == 0x73) && (local_98[2] == 0x6f)) {
LAB_0017a9f9:
        pbVar14 = local_98 + 3;
        goto LAB_0017a9fd;
      }
      break;
    case 0x76:
    case 0x7a:
      if (*local_98 == 0x65) goto LAB_0017a9b0;
    }
    if (*local_98 == 0x65) {
      pbVar14 = local_98 + 1;
      iVar8 = m_gt_1((char *)pbVar14);
      if ((iVar8 != 0) ||
         ((iVar8 = m_eq_1((char *)pbVar14), iVar8 != 0 &&
          (iVar8 = star_oh((char *)pbVar14), iVar8 == 0)))) {
        local_98 = pbVar14;
      }
    }
    pbVar14 = local_98;
    iVar8 = m_gt_1((char *)local_98);
    if (((iVar8 != 0) && (*pbVar14 == 0x6c)) && (pbVar14[1] == 0x6c)) {
      local_98 = pbVar14 + 1;
    }
    pbVar14 = local_98;
    sVar11 = strlen((char *)local_98);
    iVar8 = (int)sVar11;
    *local_90 = iVar8;
    *(char *)((long)&local_88->pModule + (long)iVar8) = '\0';
    bVar19 = *pbVar14;
    local_98 = pbVar14;
    if (bVar19 != 0) {
      pbVar13 = (byte *)((long)&local_88->pModule + (long)iVar8);
      do {
        pbVar13 = pbVar13 + -1;
        *pbVar13 = bVar19;
        bVar19 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        local_98 = pbVar14;
      } while (bVar19 != 0);
    }
LAB_0017aae8:
    *local_78 = (char *)pCursor[4].pTokenizer;
    *local_70 = iVar22;
    *local_68 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar8 = *(int *)&pCursor[3].pTokenizer;
    *(int *)&pCursor[3].pTokenizer = iVar8 + 1;
    *local_60 = iVar8;
    pzToken = (char **)0x0;
LAB_0017ab18:
    if (iVar22 < iVar17) {
      return (int)pzToken;
    }
  } while( true );
}

Assistant:

static int porterNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by porterOpen */
  const char **pzToken,               /* OUT: *pzToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  porter_tokenizer_cursor *c = (porter_tokenizer_cursor *) pCursor;
  const char *z = c->zInput;

  while( c->iOffset<c->nInput ){
    int iStartOffset, ch;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nInput && isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nInput && !isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int n = c->iOffset-iStartOffset;
      if( n>c->nAllocated ){
        char *pNew;
        c->nAllocated = n+20;
        pNew = sqlite3_realloc(c->zToken, c->nAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->zToken = pNew;
      }
      porter_stemmer(&z[iStartOffset], n, c->zToken, pnBytes);
      *pzToken = c->zToken;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;
      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}